

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

EncodedDescriptorDatabase * google::protobuf::anon_unknown_1::GeneratedDatabase(void)

{
  int iVar1;
  EncodedDescriptorDatabase *this;
  
  if ((anonymous_namespace)::GeneratedDatabase()::generated_database == '\0') {
    iVar1 = __cxa_guard_acquire(&(anonymous_namespace)::GeneratedDatabase()::generated_database);
    if (iVar1 != 0) {
      this = (EncodedDescriptorDatabase *)operator_new(0xb0);
      EncodedDescriptorDatabase::EncodedDescriptorDatabase(this);
      internal::OnShutdownRun
                (internal::OnShutdownDelete<google::protobuf::EncodedDescriptorDatabase>::
                 anon_class_1_0_00000001::__invoke,this);
      GeneratedDatabase::generated_database = this;
      __cxa_guard_release(&(anonymous_namespace)::GeneratedDatabase()::generated_database);
    }
  }
  return GeneratedDatabase::generated_database;
}

Assistant:

EncodedDescriptorDatabase* GeneratedDatabase() {
  static auto generated_database =
      internal::OnShutdownDelete(new EncodedDescriptorDatabase());
  return generated_database;
}